

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::SourceSnippet::highlightRange
          (SourceSnippet *this,SourceRange range,SourceLocation caretLoc,size_t col,
          string_view sourceLine)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  bool bVar6;
  char local_91;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  size_t local_70;
  size_t endCol;
  size_t startCol;
  size_t endOfLine;
  size_t startOfLine;
  size_t local_48;
  size_t end;
  size_t local_38;
  size_t start;
  size_t col_local;
  SourceSnippet *this_local;
  SourceLocation caretLoc_local;
  SourceRange range_local;
  
  caretLoc_local = range.startLoc;
  start = col;
  col_local = (size_t)this;
  this_local = (SourceSnippet *)caretLoc;
  end = (size_t)SourceRange::start((SourceRange *)&caretLoc_local);
  local_38 = SourceLocation::offset((SourceLocation *)&end);
  startOfLine = (size_t)SourceRange::end((SourceRange *)&caretLoc_local);
  local_48 = SourceLocation::offset((SourceLocation *)&startOfLine);
  sVar1 = SourceLocation::offset((SourceLocation *)&this_local);
  sVar2 = sVar1 - (start - 1);
  endOfLine = sVar2;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&sourceLine);
  startCol = sVar2 + sVar3;
  if (local_38 < endOfLine) {
    local_38 = endOfLine;
  }
  if (startCol < local_48) {
    local_48 = startCol;
  }
  if (local_48 <= local_38) {
    return;
  }
  local_38 = local_38 - endOfLine;
  local_48 = local_48 - endOfLine;
  while( true ) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&sourceLine,local_38)
    ;
    bVar6 = true;
    if (*pvVar4 != ' ') {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&sourceLine,local_38);
      bVar6 = *pvVar4 == '\t';
    }
    if (!bVar6) break;
    local_38 = local_38 + 1;
    if (local_38 == local_48) {
      return;
    }
  }
  while( true ) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&sourceLine,local_48 - 1);
    bVar6 = true;
    if (*pvVar4 != ' ') {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&sourceLine,local_48 - 1);
      bVar6 = *pvVar4 == '\t';
    }
    if (!bVar6) break;
    local_48 = local_48 - 1;
    if (local_38 == local_48) {
      return;
    }
  }
  endCol = getColumnForByte(this,local_38);
  local_70 = getColumnForByte(this,local_48);
  if (endCol <= local_70) {
    uVar5 = std::__cxx11::string::size();
    if (uVar5 < local_70) {
      std::__cxx11::string::resize((ulong)&this->highlightLine,(char)local_70);
    }
    local_80._M_current = (char *)std::__cxx11::string::begin();
    local_78 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_80,endCol);
    local_90._M_current = (char *)std::__cxx11::string::begin();
    local_88 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_90,local_70);
    local_91 = '~';
    std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_78,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_88,&local_91);
    return;
  }
  assert::assertFailed
            ("startCol <= endCol",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/diagnostics/TextDiagnosticClient.cpp"
             ,0xfc,
             "void slang::SourceSnippet::highlightRange(SourceRange, SourceLocation, size_t, string_view)"
            );
}

Assistant:

void highlightRange(SourceRange range, SourceLocation caretLoc, size_t col,
                        string_view sourceLine) {
        // Trim the range so that it only falls on the same line as the cursor
        size_t start = range.start().offset();
        size_t end = range.end().offset();
        size_t startOfLine = caretLoc.offset() - (col - 1);
        size_t endOfLine = startOfLine + sourceLine.length();
        if (start < startOfLine)
            start = startOfLine;
        if (end > endOfLine)
            end = endOfLine;

        if (start >= end)
            return;

        // walk the range in to skip any leading or trailing whitespace
        start -= startOfLine;
        end -= startOfLine;
        while (sourceLine[start] == ' ' || sourceLine[start] == '\t') {
            start++;
            if (start == end)
                return;
        }
        while (sourceLine[end - 1] == ' ' || sourceLine[end - 1] == '\t') {
            end--;
            if (start == end)
                return;
        }

        size_t startCol = getColumnForByte(start);
        size_t endCol = getColumnForByte(end);
        ASSERT(startCol <= endCol);

        if (highlightLine.size() < endCol)
            highlightLine.resize(endCol, ' ');

        std::fill(highlightLine.begin() + ptrdiff_t(startCol),
                  highlightLine.begin() + ptrdiff_t(endCol), '~');
    }